

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.cc
# Opt level: O0

void matras_gh_1145_test(void)

{
  void *pvVar1;
  matras_id_t local_84;
  undefined1 local_80 [4];
  matras_id_t id;
  matras_view view;
  matras local;
  
  _space(_stdout);
  printf("# *** %s ***\n","matras_gh_1145_test");
  plan(1);
  extents_in_use = 0;
  matras_create((matras *)&view.next_view,8,&ver_allocator,(matras_stats *)0x0);
  matras_create_read_view((matras *)&view.next_view,(matras_view *)local_80);
  pvVar1 = matras_alloc((matras *)&view.next_view,&local_84);
  if (pvVar1 == (void *)0x0) {
    fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",
            "matras_alloc(&local, &id) != NULL","false",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",
            0x111,"matras_gh_1145_test");
    exit(-1);
  }
  pvVar1 = matras_touch((matras *)&view.next_view,local_84);
  if (pvVar1 == (void *)0x0) {
    fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",
            "matras_touch(&local, id) != NULL","false",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",
            0x112,"matras_gh_1145_test");
    exit(-1);
  }
  matras_destroy_read_view((matras *)&view.next_view,(matras_view *)local_80);
  matras_destroy((matras *)&view.next_view);
  _ok((uint)(extents_in_use == 0),"extents_in_use == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x115,
      "line %d");
  _space(_stdout);
  printf("# *** %s: done ***\n","matras_gh_1145_test");
  check_plan();
  return;
}

Assistant:

void
matras_gh_1145_test()
{
	header();
	plan(1);

	struct matras local;
	extents_in_use = 0;
	matras_create(&local, sizeof(type_t), &ver_allocator, NULL);
	struct matras_view view;
	matras_create_read_view(&local, &view);
	matras_id_t id;
	fail_unless(matras_alloc(&local, &id) != NULL);
	fail_unless(matras_touch(&local, id) != NULL);
	matras_destroy_read_view(&local, &view);
	matras_destroy(&local);
	ok(extents_in_use == 0);

	footer();
	check_plan();
}